

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall
slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>::SmallVector
          (SmallVector<(anonymous_namespace)::Constructable,_2UL> *this,
          SmallVector<(anonymous_namespace)::Constructable,_2UL> *other)

{
  SmallVector(this,&other->super_SmallVectorBase<(anonymous_namespace)::Constructable>);
  return;
}

Assistant:

SmallVector(const SmallVector& other) : SmallVector(static_cast<const Base&>(other)) {}